

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_iflist.c
# Opt level: O1

void csp_iflist_add(csp_iface_t *ifc)

{
  char *__s1;
  csp_iface_t *pcVar1;
  int iVar2;
  csp_iface_t *pcVar3;
  csp_iface_t **ppcVar4;
  
  if ((ifc != (csp_iface_t *)0x0) && (__s1 = ifc->name, __s1 != (char *)0x0)) {
    ifc->next = (csp_iface_s *)0x0;
    pcVar1 = interfaces;
    if (interfaces == (csp_iface_t *)0x0) {
      ppcVar4 = &interfaces;
    }
    else {
      do {
        pcVar3 = pcVar1;
        if (pcVar3 == ifc) {
          return;
        }
        iVar2 = strncmp(__s1,pcVar3->name,10);
        if (iVar2 == 0) {
          return;
        }
        pcVar1 = pcVar3->next;
      } while (pcVar3->next != (csp_iface_s *)0x0);
      ppcVar4 = &pcVar3->next;
    }
    *ppcVar4 = ifc;
  }
  return;
}

Assistant:

void csp_iflist_add(csp_iface_t * ifc) {

	if ((ifc == NULL) || (ifc->name == NULL)) {
		return;
	}

	ifc->next = NULL;

	/* Add interface to pool */
	if (interfaces == NULL) {
		/* This is the first interface to be added */
		interfaces = ifc;
	} else {
		/* Insert interface last if not already in pool */
		csp_iface_t * last = NULL;
		for (csp_iface_t * i = interfaces; i != NULL; i = i->next) {
			if ((i == ifc) || (strncmp(ifc->name, i->name, CSP_IFLIST_NAME_MAX) == 0)) {
				return;
			}
			last = i;
		}

		last->next = ifc;
	}

}